

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_posix.cpp
# Opt level: O2

bool QSharedMemoryPosix::runtimeSupportCheck(void)

{
  int iVar1;
  int *piVar2;
  
  if (runtimeSupportCheck()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&runtimeSupportCheck()::result);
    if (iVar1 != 0) {
      shm_open("",0,0);
      piVar2 = __errno_location();
      runtimeSupportCheck::result = *piVar2 != 0x26;
      __cxa_guard_release(&runtimeSupportCheck()::result);
    }
  }
  return runtimeSupportCheck::result;
}

Assistant:

bool QSharedMemoryPosix::runtimeSupportCheck()
{
    static const bool result = []() {
        (void)shm_open("", 0, 0);         // this WILL fail
        return errno != ENOSYS;
    }();
    return result;
}